

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
               (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
                *matrix,map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  void *pvVar5;
  long lVar6;
  long *plVar7;
  Index IVar8;
  bool bVar9;
  _Rb_tree_node_base *p_Var10;
  long lVar11;
  _Rb_tree_header *p_Var12;
  pointer *pppVar13;
  undefined4 local_314;
  undefined *local_310;
  undefined4 *local_308;
  undefined **local_300;
  undefined **local_2f8;
  ulong local_2f0;
  shared_count sStack_2e8;
  undefined4 **local_2e0;
  char *local_2d8;
  char *local_2d0;
  shared_count sStack_2c8;
  undefined **local_2c0;
  undefined1 local_2b8;
  undefined8 *local_2b0;
  undefined ***local_2a8;
  undefined4 **local_2a0;
  char *local_298;
  undefined **local_290;
  char *local_288;
  shared_count sStack_280;
  char *local_278;
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *local_270;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
  *local_268;
  undefined1 local_260 [40];
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_238;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 local_188 [104];
  undefined8 local_120;
  undefined8 uStack_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_260,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_188,
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_260);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_260);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_188);
  build_column_values<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_260,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_188,
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_260);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_260);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_188);
  local_268 = matrix;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>
  ::
  Naive_vector_column<std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
            ((Naive_vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,true>>>*,8ul,void,void>>
              *)local_188,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  p_Var1 = &(rows->_M_t)._M_impl.super__Rb_tree_header;
  p_Var10 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_270 = rows;
  IVar8 = local_188._0_4_;
  while ((_Rb_tree_header *)p_Var10 != p_Var1) {
    local_188._0_4_ = IVar8;
    if (p_Var10[1]._M_parent != (_Base_ptr)&p_Var10[1]._M_parent &&
        p_Var10[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var10[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_198 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_190 = "";
        local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x20d);
        local_2f0 = local_2f0 & 0xffffffffffffff00;
        local_2f8 = &PTR__lazy_ostream_0022a430;
        sStack_2e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2e0 = (undefined4 **)0x1e62f2;
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_308 = (undefined4 *)CONCAT44(local_308._4_4_,iVar3);
        local_310 = (undefined *)CONCAT44(local_310._4_4_,6);
        local_290 = (undefined **)CONCAT71(local_290._1_7_,iVar3 == 6);
        local_288 = (char *)0x0;
        sStack_280.pi_ = (sp_counted_base *)0x0;
        local_2d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_2d0 = "";
        local_2a0 = &local_308;
        local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
        local_260._0_8_ = &PTR__lazy_ostream_0022a930;
        local_260._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_260._24_8_ = &local_2a0;
        local_300 = &local_310;
        local_2b8 = 0;
        local_2c0 = &PTR__lazy_ostream_0022a6b0;
        local_2b0 = &boost::unit_test::lazy_ostream::inst;
        local_2a8 = &local_300;
        boost::test_tools::tt_detail::report_assertion
                  (&local_290,&local_2f8,&local_2d8,0x20d,1,2,2,"entry.get_column_index()",local_260
                   ,"6",&local_2c0);
        boost::detail::shared_count::~shared_count(&sStack_280);
      }
    }
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    IVar8 = local_188._0_4_;
  }
  local_188._0_4_ = 0;
  local_260._4_4_ = (undefined4)((ulong)local_260._0_8_ >> 0x20);
  local_260._0_4_ = IVar8;
  local_260._16_8_ = &local_238;
  local_260._24_8_ = (undefined *)0x0;
  local_260._32_8_ = 8;
  local_260._8_8_ = local_188._8_8_;
  boost::container::
  small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
  ::move_construct_impl
            ((small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_void,_void>
              *)(local_260 + 0x10),(base_type *)(local_188 + 0x10),
             (allocator_type *)(local_188 + 0x10));
  local_1f8 = (undefined4)local_120;
  uStack_1f4 = local_120._4_4_;
  uStack_1f0 = (undefined4)uStack_118;
  uStack_1ec = uStack_118._4_4_;
  local_120 = (Field_operators *)0x0;
  uStack_118 = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_0022a430;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_300 = &local_310;
  local_310 = (undefined *)local_260._24_8_;
  local_308 = &local_314;
  local_314 = 4;
  local_2d0 = (char *)0x0;
  sStack_2c8.pi_ = (sp_counted_base *)0x0;
  local_2a0 = (undefined4 **)0x1e6a4c;
  local_298 = "";
  local_2a8 = &local_300;
  local_2b8 = 0;
  local_2c0 = &PTR__lazy_ostream_0022a3f0;
  local_2b0 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2f0 = local_2f0 & 0xffffffffffffff00;
  local_2f8 = &PTR__lazy_ostream_0022a6b0;
  sStack_2e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2d8._0_1_ = (undefined *)local_260._24_8_ == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_0022a430;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_310 = (undefined *)local_188._24_8_;
  local_2d8 = (char *)CONCAT71(local_2d8._1_7_,(undefined *)local_188._24_8_ == (undefined *)0x0);
  local_314 = 0;
  local_2d0 = (char *)0x0;
  sStack_2c8.pi_ = (sp_counted_base *)0x0;
  local_2a0 = (undefined4 **)0x1e6a4c;
  local_298 = "";
  local_300 = &local_310;
  local_2b8 = 0;
  local_2c0 = &PTR__lazy_ostream_0022a3f0;
  local_2b0 = &boost::unit_test::lazy_ostream::inst;
  local_2a8 = &local_300;
  local_308 = &local_314;
  local_2f0 = local_2f0 & 0xffffffffffffff00;
  local_2f8 = &PTR__lazy_ostream_0022a6b0;
  sStack_2e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (&local_2d8,&local_290,&local_2a0,0x21d,1,2,2,"col.size()",&local_2c0,"0",&local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2c8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar9 = Gudhi::persistence_matrix::operator==
                    ((local_268->
                     super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                      *)local_260);
  local_2f8 = (undefined **)CONCAT71(local_2f8._1_7_,bVar9);
  local_2f0 = 0;
  sStack_2e8.pi_ = (sp_counted_base *)0x0;
  local_290 = (undefined **)0x1f0c1f;
  local_288 = "";
  local_2b8 = 0;
  local_2c0 = &PTR__lazy_ostream_0022a3a0;
  local_2b0 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_2a8 = &local_290;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e8);
  for (p_Var10 = (local_270->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != p_Var1;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    if (p_Var10[1]._M_parent != (_Base_ptr)&p_Var10[1]._M_parent &&
        p_Var10[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var10[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_1b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_1b0 = "";
        local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x225,
                   &local_1c8);
        local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
        local_290 = &PTR__lazy_ostream_0022a430;
        sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_278 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_310 = (undefined *)CONCAT44(local_310._4_4_,iVar3);
        local_314 = 6;
        local_2d8 = (char *)CONCAT71(local_2d8._1_7_,iVar3 == 6);
        local_2d0 = (char *)0x0;
        sStack_2c8.pi_ = (sp_counted_base *)0x0;
        local_2a0 = (undefined4 **)0x1e6a4c;
        local_298 = "";
        local_300 = &local_310;
        local_2b8 = 0;
        local_2c0 = &PTR__lazy_ostream_0022a930;
        local_2b0 = &boost::unit_test::lazy_ostream::inst;
        local_2a8 = &local_300;
        local_308 = &local_314;
        local_2f0 = local_2f0 & 0xffffffffffffff00;
        local_2f8 = &PTR__lazy_ostream_0022a6b0;
        sStack_2e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2e0 = &local_308;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2d8,&local_290,&local_2a0,0x225,1,2,2,"entry.get_column_index()",
                   &local_2c0,"6",&local_2f8);
        boost::detail::shared_count::~shared_count(&sStack_2c8);
      }
    }
  }
  Gudhi::persistence_matrix::swap
            ((Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
              *)local_188,
             (Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
              *)local_260);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_0022a430;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_310 = (undefined *)local_260._24_8_;
  local_314 = 0;
  local_2d0 = (char *)0x0;
  sStack_2c8.pi_ = (sp_counted_base *)0x0;
  local_2a0 = (undefined4 **)0x1e6a4c;
  local_298 = "";
  local_300 = &local_310;
  local_2b8 = 0;
  local_2c0 = &PTR__lazy_ostream_0022a3f0;
  local_2b0 = &boost::unit_test::lazy_ostream::inst;
  local_2a8 = &local_300;
  local_308 = &local_314;
  local_2f0 = local_2f0 & 0xffffffffffffff00;
  local_2f8 = &PTR__lazy_ostream_0022a6b0;
  sStack_2e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2d8._0_1_ = (undefined *)local_260._24_8_ == (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c8);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
  local_290 = &PTR__lazy_ostream_0022a430;
  sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_310 = (undefined *)local_188._24_8_;
  local_2d8 = (char *)CONCAT71(local_2d8._1_7_,(undefined *)local_188._24_8_ == (undefined *)0x4);
  local_314 = 4;
  local_2d0 = (char *)0x0;
  sStack_2c8.pi_ = (sp_counted_base *)0x0;
  local_2a0 = (undefined4 **)0x1e6a4c;
  local_298 = "";
  local_300 = &local_310;
  local_2b8 = 0;
  local_2c0 = &PTR__lazy_ostream_0022a3f0;
  local_2b0 = &boost::unit_test::lazy_ostream::inst;
  local_2a8 = &local_300;
  local_308 = &local_314;
  local_2f0 = local_2f0 & 0xffffffffffffff00;
  local_2f8 = &PTR__lazy_ostream_0022a6b0;
  sStack_2e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (&local_2d8,&local_290,&local_2a0,0x235,1,2,2,"col.size()",&local_2c0,"4",&local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2c8);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar9 = Gudhi::persistence_matrix::operator==
                    ((local_268->
                     super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_true>_>_>_*,_8UL,_void,_void>_>
                      *)local_188);
  local_2f8 = (undefined **)CONCAT71(local_2f8._1_7_,bVar9);
  local_2f0 = 0;
  sStack_2e8.pi_ = (sp_counted_base *)0x0;
  local_290 = (undefined **)0x1f0c34;
  local_288 = "";
  local_2b8 = 0;
  local_2c0 = &PTR__lazy_ostream_0022a3a0;
  local_2b0 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_2a8 = &local_290;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e8);
  p_Var10 = (local_270->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = (_Rb_tree_header *)local_260._16_8_;
  while (local_260._16_8_ = p_Var12, (_Rb_tree_header *)p_Var10 != p_Var1) {
    if (p_Var10[1]._M_parent != (_Base_ptr)&p_Var10[1]._M_parent &&
        p_Var10[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var10[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_1d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_1d0 = "";
        local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x23d,
                   &local_1e8);
        local_288 = (char *)((ulong)local_288 & 0xffffffffffffff00);
        local_290 = &PTR__lazy_ostream_0022a430;
        sStack_280.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_278 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_310 = (undefined *)CONCAT44(local_310._4_4_,iVar3);
        local_314 = 6;
        local_2d8 = (char *)CONCAT71(local_2d8._1_7_,iVar3 == 6);
        local_2d0 = (char *)0x0;
        sStack_2c8.pi_ = (sp_counted_base *)0x0;
        local_2a0 = (undefined4 **)0x1e6a4c;
        local_298 = "";
        local_300 = &local_310;
        local_2b8 = 0;
        local_2c0 = &PTR__lazy_ostream_0022a930;
        local_2b0 = &boost::unit_test::lazy_ostream::inst;
        local_2a8 = &local_300;
        local_308 = &local_314;
        local_2f0 = local_2f0 & 0xffffffffffffff00;
        local_2f8 = &PTR__lazy_ostream_0022a6b0;
        sStack_2e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2e0 = &local_308;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2d8,&local_290,&local_2a0,0x23d,1,2,2,"entry.get_column_index()",
                   &local_2c0,"6",&local_2f8);
        boost::detail::shared_count::~shared_count(&sStack_2c8);
      }
    }
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    p_Var12 = (_Rb_tree_header *)local_260._16_8_;
  }
  if ((undefined *)local_260._24_8_ != (undefined *)0x0) {
    lVar11 = local_260._24_8_ << 3;
    do {
      if (p_Var12 == (_Rb_tree_header *)0x0) goto LAB_001b9228;
      pvVar5 = *(void **)&((_Rep_type *)&p_Var12->_M_header)->_M_impl;
      if ((((pointer)local_260._8_8_ != (pointer)0x0) || (pvVar5 != (void *)0x0)) &&
         (lVar6 = *(long *)((long)pvVar5 + 8), lVar6 != 0)) {
        plVar7 = *(long **)((long)pvVar5 + 0x10);
        *plVar7 = lVar6;
        *(long **)(lVar6 + 8) = plVar7;
      }
      operator_delete(pvVar5,0x20);
      p_Var12 = &(((_Rep_type *)&p_Var12->_M_header)->_M_impl).super__Rb_tree_header;
      lVar11 = lVar11 + -8;
    } while (lVar11 != 0);
  }
  if ((local_260._32_8_ != 0) &&
     (&local_238 !=
      (set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       *)local_260._16_8_)) {
    operator_delete((void *)local_260._16_8_);
  }
  if ((undefined *)local_188._24_8_ != (undefined *)0x0) {
    lVar11 = local_188._24_8_ << 3;
    pppVar13 = (pointer *)local_188._16_8_;
    do {
      if ((pointer)pppVar13 == (pointer)0x0) {
LAB_001b9228:
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, true>>> **, false>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, true>>> **, IsConst = false]"
                     );
      }
      pvVar5 = *pppVar13;
      if ((((pointer)local_188._8_8_ != (pointer)0x0) || (pvVar5 != (void *)0x0)) &&
         (lVar6 = *(long *)((long)pvVar5 + 8), lVar6 != 0)) {
        plVar7 = *(long **)((long)pvVar5 + 0x10);
        *plVar7 = lVar6;
        *(long **)(lVar6 + 8) = plVar7;
      }
      operator_delete(pvVar5,0x20);
      pppVar13 = pppVar13 + 1;
      lVar11 = lVar11 + -8;
    } while (lVar11 != 0);
  }
  if ((local_188._32_8_ != 0) && ((pointer)(local_188 + 0x28) != (pointer)local_188._16_8_)) {
    operator_delete((void *)local_188._16_8_);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}